

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

void __thiscall
leveldb::anon_unknown_1::PosixEnv::Schedule
          (PosixEnv *this,_func_void_void_ptr *background_work_function,void *background_work_arg)

{
  _Map_pointer __src;
  ulong uVar1;
  _Map_pointer ppBVar2;
  BackgroundWorkItem *pBVar3;
  _Elt_pointer pBVar4;
  undefined8 uVar5;
  size_t sVar6;
  long lVar7;
  _Map_pointer ppBVar8;
  long lVar9;
  _Map_pointer __dest;
  long in_FS_OFFSET;
  thread background_thread;
  long *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::mutex::lock(&(this->background_work_mutex_).mu_);
  if (this->started_background_thread_ == false) {
    this->started_background_thread_ = true;
    background_thread._M_id._M_thread = (id)0;
    local_40 = (long *)operator_new(0x18);
    *local_40 = (long)&PTR___State_01157118;
    local_40[1] = (long)this;
    local_40[2] = (long)BackgroundThreadEntryPoint;
    std::thread::_M_start_thread(&background_thread,&local_40,0);
    if (local_40 != (long *)0x0) {
      (**(code **)(*local_40 + 8))();
    }
    std::thread::detach();
    std::thread::~thread(&background_thread);
  }
  pBVar4 = (this->background_work_queue_).c.
           super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pBVar4 == (this->background_work_queue_).c.
                super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    std::condition_variable::notify_one();
    pBVar4 = (this->background_work_queue_).c.
             super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  }
  if (pBVar4 == (this->background_work_queue_).c.
                super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    ppBVar8 = (this->background_work_queue_).c.
              super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    __src = (this->background_work_queue_).c.
            super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
    lVar9 = (long)ppBVar8 - (long)__src >> 3;
    if (((long)(this->background_work_queue_).c.
               super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last -
         (long)(this->background_work_queue_).c.
               super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
        (lVar9 + -1 + (ulong)(ppBVar8 == (_Map_pointer)0x0)) * 0x20 +
        ((long)pBVar4 -
         (long)(this->background_work_queue_).c.
               super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) == 0xfffffffffffffff) {
LAB_00a5a747:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        uVar5 = std::__throw_length_error("cannot create std::deque larger than max_size()");
        std::thread::~thread(&background_thread);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          _Unwind_Resume(uVar5);
        }
      }
      goto LAB_00a5a7a5;
    }
    ppBVar2 = (this->background_work_queue_).c.
              super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
              ._M_impl.super__Deque_impl_data._M_map;
    uVar1 = (this->background_work_queue_).c.
            super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
            ._M_impl.super__Deque_impl_data._M_map_size;
    if (uVar1 - ((long)ppBVar8 - (long)ppBVar2 >> 3) < 2) {
      if (lVar9 * 2 + 4U < uVar1) {
        __dest = (_Map_pointer)((long)ppBVar2 + (uVar1 - (lVar9 + 2) & 0xfffffffffffffffe) * 4);
        if (__dest < __src) {
          sVar6 = (long)ppBVar8 + (8 - (long)__src);
          ppBVar8 = __dest;
          if (sVar6 != 0) {
LAB_00a5a645:
            memmove(ppBVar8,__src,sVar6);
          }
        }
        else {
          sVar6 = (long)ppBVar8 + (8 - (long)__src);
          if (sVar6 != 0) {
            ppBVar8 = (_Map_pointer)((long)__dest + ((lVar9 + 1) * 8 - sVar6));
            goto LAB_00a5a645;
          }
        }
      }
      else {
        lVar7 = uVar1 * 2 + (ulong)(uVar1 == 0);
        uVar1 = lVar7 + 2;
        if (0xfffffffffffffff < uVar1) {
          if (uVar1 >> 0x3d != 0) {
            if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00a5a7a5;
            std::__throw_bad_array_new_length();
          }
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00a5a7a5;
          std::__throw_bad_alloc();
          goto LAB_00a5a747;
        }
        ppBVar2 = (_Map_pointer)operator_new(uVar1 * 8);
        __dest = (_Map_pointer)((long)ppBVar2 + (lVar7 - lVar9 & 0xfffffffffffffffeU) * 4);
        ppBVar8 = (this->background_work_queue_).c.
                  super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
        sVar6 = (long)(this->background_work_queue_).c.
                      super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node + (8 - (long)ppBVar8);
        if (sVar6 != 0) {
          memmove(__dest,ppBVar8,sVar6);
        }
        operator_delete((this->background_work_queue_).c.
                        super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                        ._M_impl.super__Deque_impl_data._M_map,
                        (this->background_work_queue_).c.
                        super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                        ._M_impl.super__Deque_impl_data._M_map_size << 3);
        (this->background_work_queue_).c.
        super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
        ._M_impl.super__Deque_impl_data._M_map = ppBVar2;
        (this->background_work_queue_).c.
        super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
        ._M_impl.super__Deque_impl_data._M_map_size = uVar1;
      }
      (this->background_work_queue_).c.
      super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node = __dest;
      pBVar3 = *__dest;
      (this->background_work_queue_).c.
      super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
      ._M_impl.super__Deque_impl_data._M_start._M_first = pBVar3;
      (this->background_work_queue_).c.
      super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
      ._M_impl.super__Deque_impl_data._M_start._M_last = pBVar3 + 0x20;
      (this->background_work_queue_).c.
      super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_node = __dest + lVar9;
      pBVar3 = __dest[lVar9];
      (this->background_work_queue_).c.
      super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first = pBVar3;
      (this->background_work_queue_).c.
      super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last = pBVar3 + 0x20;
    }
    pBVar3 = (BackgroundWorkItem *)operator_new(0x200);
    (this->background_work_queue_).c.
    super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_node[1] = pBVar3;
    pBVar4 = (this->background_work_queue_).c.
             super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    pBVar4->function = background_work_function;
    pBVar4->arg = background_work_arg;
    ppBVar8 = (this->background_work_queue_).c.
              super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    (this->background_work_queue_).c.
    super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_node = ppBVar8 + 1;
    pBVar4 = ppBVar8[1];
    (this->background_work_queue_).c.
    super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_first = pBVar4;
    (this->background_work_queue_).c.
    super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_last = pBVar4 + 0x20;
  }
  else {
    pBVar4->function = background_work_function;
    pBVar4->arg = background_work_arg;
    pBVar4 = pBVar4 + 1;
  }
  (this->background_work_queue_).c.
  super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = pBVar4;
  pthread_mutex_unlock((pthread_mutex_t *)&this->background_work_mutex_);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00a5a7a5:
  __stack_chk_fail();
}

Assistant:

void PosixEnv::Schedule(
    void (*background_work_function)(void* background_work_arg),
    void* background_work_arg) {
  background_work_mutex_.Lock();

  // Start the background thread, if we haven't done so already.
  if (!started_background_thread_) {
    started_background_thread_ = true;
    std::thread background_thread(PosixEnv::BackgroundThreadEntryPoint, this);
    background_thread.detach();
  }

  // If the queue is empty, the background thread may be waiting for work.
  if (background_work_queue_.empty()) {
    background_work_cv_.Signal();
  }

  background_work_queue_.emplace(background_work_function, background_work_arg);
  background_work_mutex_.Unlock();
}